

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,optional<long> *v)

{
  bool bVar1;
  ostream *poVar2;
  value_type_conflict1 *value;
  allocator local_79;
  string local_78;
  string local_58 [32];
  string local_38 [32];
  
  poVar2 = std::operator<<(os,"[optional:");
  bVar1 = v->has_value_;
  if (bVar1 == true) {
    value = nonstd::optional_lite::optional<long>::operator*(v);
    to_string<long>(&local_78,value);
    std::__cxx11::string::string(local_58,(string *)&local_78);
  }
  else {
    std::__cxx11::string::string(local_38,"[empty]",&local_79);
    std::__cxx11::string::string((string *)&local_78,local_38);
    std::__cxx11::string::string(local_58,(string *)&local_78);
  }
  poVar2 = std::operator<<(poVar2,local_58);
  poVar2 = std::operator<<(poVar2,"]");
  std::__cxx11::string::_M_dispose();
  if (bVar1 == false) {
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}